

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O0

int testStateSpecificationVersion(void)

{
  bool bVar1;
  ResultType RVar2;
  ModelDescription *this;
  FeatureDescription *feature;
  ostream *poVar3;
  Result local_100;
  Result local_d8;
  undefined4 local_ac;
  Result local_a8;
  ValidationPolicy local_7d;
  allocator<char> local_79;
  undefined1 local_78 [3];
  ValidationPolicy validationPolicy;
  ModelDescription *description;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&description);
  this = CoreML::Specification::Model::mutable_description((Model *)&description);
  feature = CoreML::Specification::ModelDescription::add_state(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"x",&local_79);
  setupStateFeature(feature,(string *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  std::allocator<char>::~allocator(&local_79);
  local_7d = validationPolicyForStateTests();
  CoreML::validateModelDescription(&local_a8,this,8,&local_7d);
  bVar1 = CoreML::Result::good(&local_a8);
  CoreML::Result::~Result(&local_a8);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x197);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,
                             "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS17, validationPolicy))).good())"
                            );
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    m._oneof_case_[0] = 1;
  }
  else {
    CoreML::validateModelDescription(&local_d8,this,8,&local_7d);
    RVar2 = CoreML::Result::type(&local_d8);
    CoreML::Result::~Result(&local_d8);
    if (RVar2 == INVALID_COMPATIBILITY_VERSION) {
      CoreML::validateModelDescription(&local_100,this,9,&local_7d);
      bVar1 = CoreML::Result::good(&local_100);
      CoreML::Result::~Result(&local_100);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        m._oneof_case_[0] = 0;
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x198);
        poVar3 = std::operator<<(poVar3,": error: ");
        poVar3 = std::operator<<(poVar3,
                                 "(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).good()"
                                );
        poVar3 = std::operator<<(poVar3," was false, expected true.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        m._oneof_case_[0] = 1;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x197);
      poVar3 = std::operator<<(poVar3,": error: ");
      poVar3 = std::operator<<(poVar3,
                               "((ResultType::INVALID_COMPATIBILITY_VERSION)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS17, validationPolicy)).type())"
                              );
      poVar3 = std::operator<<(poVar3," was false, expected true.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      m._oneof_case_[0] = 1;
    }
  }
  local_ac = 1;
  CoreML::Specification::Model::~Model((Model *)&description);
  return m._oneof_case_[0];
}

Assistant:

int testStateSpecificationVersion() {
    Specification::Model m;
    auto *description = m.mutable_description();
    setupStateFeature(description->add_state(), "x");

    // Check model specification version requirements.
    auto validationPolicy = validationPolicyForStateTests();
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS17, validationPolicy), ResultType::INVALID_COMPATIBILITY_VERSION);
    ML_ASSERT_GOOD(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy));

    return 0;
}